

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

UNormalizationCheckResult __thiscall
icu_63::Normalizer2Impl::getCompQuickCheck(Normalizer2Impl *this,uint16_t norm16)

{
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  if ((norm16 < this->minNoNo) || (0xfe01 < norm16)) {
    this_local._4_4_ = UNORM_YES;
  }
  else if (norm16 < this->minMaybeYes) {
    this_local._4_4_ = UNORM_NO;
  }
  else {
    this_local._4_4_ = UNORM_MAYBE;
  }
  return this_local._4_4_;
}

Assistant:

UNormalizationCheckResult getCompQuickCheck(uint16_t norm16) const {
        if(norm16<minNoNo || MIN_YES_YES_WITH_CC<=norm16) {
            return UNORM_YES;
        } else if(minMaybeYes<=norm16) {
            return UNORM_MAYBE;
        } else {
            return UNORM_NO;
        }
    }